

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

tensor_traits * ggml_aarch64_get_optimal_repack_type(ggml_tensor *cur)

{
  ggml_type gVar1;
  int iVar2;
  
  gVar1 = cur->type;
  if (gVar1 == GGML_TYPE_IQ4_NL) {
    iVar2 = ggml_cpu_has_neon();
    if (((iVar2 != 0) && (iVar2 = ggml_cpu_has_dotprod(), iVar2 != 0)) && ((cur->ne[1] & 3) == 0)) {
      return (tensor_traits *)&ggml::cpu::aarch64::iq4_nl_4x4_q8_0;
    }
  }
  else if (gVar1 == GGML_TYPE_Q4_K) {
    iVar2 = ggml_cpu_has_avx2();
    if ((iVar2 != 0) && ((cur->ne[1] & 7) == 0)) {
      return (tensor_traits *)&ggml::cpu::aarch64::q4_K_8x8_q8_K;
    }
  }
  else if (gVar1 == GGML_TYPE_Q4_0) {
    iVar2 = ggml_cpu_has_avx2();
    if (((iVar2 != 0) ||
        (((iVar2 = ggml_cpu_has_sve(), iVar2 != 0 &&
          (iVar2 = ggml_cpu_has_matmul_int8(), iVar2 != 0)) &&
         (iVar2 = ggml_cpu_get_sve_cnt(), iVar2 == 0x20)))) && ((cur->ne[1] & 7) == 0)) {
      return (tensor_traits *)&ggml::cpu::aarch64::q4_0_8x8_q8_0;
    }
    iVar2 = ggml_cpu_has_neon();
    if (((iVar2 != 0) && (iVar2 = ggml_cpu_has_matmul_int8(), iVar2 != 0)) &&
       ((cur->ne[1] & 3) == 0)) {
      return (tensor_traits *)&ggml::cpu::aarch64::q4_0_4x8_q8_0;
    }
    iVar2 = ggml_cpu_has_neon();
    if (((iVar2 != 0) && (iVar2 = ggml_cpu_has_dotprod(), iVar2 != 0)) && ((cur->ne[1] & 3) == 0)) {
      return (tensor_traits *)&ggml::cpu::aarch64::q4_0_4x4_q8_0;
    }
  }
  return (tensor_traits *)0x0;
}

Assistant:

static const ggml::cpu::tensor_traits * ggml_aarch64_get_optimal_repack_type(const struct ggml_tensor * cur) {
    if (cur->type == GGML_TYPE_Q4_0) {
        if (ggml_cpu_has_avx2() || (ggml_cpu_has_sve() && ggml_cpu_has_matmul_int8() && ggml_cpu_get_sve_cnt() == QK8_0)) {
            if (cur->ne[1] % 8 == 0) {
                return &ggml::cpu::aarch64::q4_0_8x8_q8_0;
            }
        }
        if (ggml_cpu_has_neon() && ggml_cpu_has_matmul_int8()) {
            if (cur->ne[1] % 4 == 0) {
                return &ggml::cpu::aarch64::q4_0_4x8_q8_0;
            }
        }
        if (ggml_cpu_has_neon() && ggml_cpu_has_dotprod()) {
            if (cur->ne[1] % 4 == 0) {
                return &ggml::cpu::aarch64::q4_0_4x4_q8_0;
            }
        }
    } else if (cur->type == GGML_TYPE_Q4_K) {
        if (ggml_cpu_has_avx2()) {
            if (cur->ne[1] % 8 == 0) {
                return &ggml::cpu::aarch64::q4_K_8x8_q8_K;
            }
        }
    } else if (cur->type == GGML_TYPE_IQ4_NL) {
        if (ggml_cpu_has_neon() && ggml_cpu_has_dotprod()) {
            if (cur->ne[1] % 4 == 0) {
                return &ggml::cpu::aarch64::iq4_nl_4x4_q8_0;
            }
        }
    }

    return nullptr;
}